

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void llvm::yaml::ScalarTraits<llvm::yaml::Hex16,_void>::output
               (Hex16 *Val,void *param_2,raw_ostream *Out)

{
  raw_ostream *this;
  uint16_t *puVar1;
  format_object<unsigned_short> local_40;
  uint16_t local_22;
  raw_ostream *prStack_20;
  uint16_t Num;
  raw_ostream *Out_local;
  void *param_1_local;
  Hex16 *Val_local;
  
  prStack_20 = Out;
  Out_local = (raw_ostream *)param_2;
  param_1_local = Val;
  puVar1 = Hex16::operator_cast_to_unsigned_short_(Val);
  this = prStack_20;
  local_22 = *puVar1;
  format<unsigned_short>(&local_40,"0x%04X",&local_22);
  raw_ostream::operator<<(this,&local_40.super_format_object_base);
  return;
}

Assistant:

void ScalarTraits<Hex16>::output(const Hex16 &Val, void *, raw_ostream &Out) {
  uint16_t Num = Val;
  Out << format("0x%04X", Num);
}